

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

bool __thiscall QCss::Parser::test(Parser *this,TokenType t)

{
  QList<QCss::Symbol> *this_00;
  qsizetype qVar1;
  const_reference pSVar2;
  TokenType in_ESI;
  QList<QCss::Symbol> *in_RDI;
  bool local_1;
  
  this_00 = (QList<QCss::Symbol> *)(long)*(int *)&in_RDI[1].d.d;
  qVar1 = QList<QCss::Symbol>::size(in_RDI);
  if ((long)this_00 < qVar1) {
    pSVar2 = QList<QCss::Symbol>::at(this_00,(qsizetype)in_RDI);
    if (pSVar2->token == in_ESI) {
      *(int *)&in_RDI[1].d.d = *(int *)&in_RDI[1].d.d + 1;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Parser::test(QCss::TokenType t)
{
    if (index >= symbols.size())
        return false;
    if (symbols.at(index).token == t) {
        ++index;
        return true;
    }
    return false;
}